

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

UniValue * __thiscall UniValue::operator[](UniValue *this,size_t index)

{
  const_reference pvVar1;
  long in_FS_OFFSET;
  
  if ((this->typ - VOBJ < 2) &&
     (index < (ulong)(((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x58))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      pvVar1 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&this->values,index);
      return pvVar1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return &NullUniValue;
  }
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::operator[](size_t index) const
{
    if (typ != VOBJ && typ != VARR)
        return NullUniValue;
    if (index >= values.size())
        return NullUniValue;

    return values.at(index);
}